

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O1

void __thiscall
BayesianGameCollaborativeGraphical::SetProbabilityDistribution
          (BayesianGameCollaborativeGraphical *this,PDDiscreteInterface *pd)

{
  pointer ppBVar1;
  BayesianGameIdenticalPayoff *this_00;
  PDDiscreteInterface *pPVar2;
  size_t sVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  ulong uVar5;
  Index jtI_e;
  ulong uVar6;
  value_type local_68;
  void *local_60 [2];
  long local_50;
  sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  local_48;
  
  pPVar2 = (PDDiscreteInterface *)(**(code **)(*(long *)pd + 0x40))(pd);
  this->_m_jt_pd = pPVar2;
  (**(code **)(*(long *)pPVar2 + 0x38))(pPVar2);
  if (this->_m_nrLRFs != 0) {
    uVar5 = 0;
    do {
      ppBVar1 = (this->_m_LRFs).
                super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->_m_LRFs).
                        super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3) <= uVar5) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5
                  );
      }
      this_00 = ppBVar1[uVar5];
      (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0x16])(local_60,this,uVar5);
      uVar6 = 0;
      while( true ) {
        sVar3 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)this_00);
        if (sVar3 <= uVar6) break;
        pvVar4 = BayesianGameBase::JointToIndividualTypeIndices
                           ((BayesianGameBase *)this_00,(Index)uVar6);
        local_68 = (value_type)
                   (**(code **)(*(long *)this->_m_jt_pd + 0x20))(this->_m_jt_pd,local_60,pvVar4);
        if ((this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            _m_useSparse == true) {
          local_48.
          super_container_reference<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
          .c_ = &(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                 _m_jTypeProbsSparse;
          local_48.i_ = uVar6;
          boost::numeric::ublas::
          sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
          ::set(&local_48,&local_68);
        }
        else {
          *(value_type *)
           (*(long *)&(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                      _m_jTypeProbs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + uVar6 * 8) = local_68;
        }
        uVar6 = (ulong)((Index)uVar6 + 1);
      }
      (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0xf])(this_00);
      if (local_60[0] != (void *)0x0) {
        operator_delete(local_60[0],local_50 - (long)local_60[0]);
      }
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (uVar5 < this->_m_nrLRFs);
  }
  return;
}

Assistant:

void BayesianGameCollaborativeGraphical::
SetProbabilityDistribution(const PDDiscreteInterface* pd)
{
    //first create a clone of the pd
    _m_jt_pd = pd->Clone(); 

    _m_jt_pd->SanityCheck();
    //next make sure that all the edges use consistent probs

    for(Index e = 0; e < _m_nrLRFs; e++)
    {   
        BayesianGameIdenticalPayoff& edge(*(_m_LRFs.at(e)) );
        const Scope& sc_e = GetScope(e);

        for(Index jtI_e=0; jtI_e < edge.GetNrJointTypes(); jtI_e++)
        {
            const vector<Index>& indTypes_e = edge.JointToIndividualTypeIndices(jtI_e);
            double p = _m_jt_pd->Get( sc_e, indTypes_e);
            edge.SetProbability(jtI_e, p);
        }
        edge.SanityCheck();
    }
    
}